

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_Boolean
isNodeInTree(UA_NodeStore *ns,UA_NodeId *leafNode,UA_NodeId *nodeToFind,UA_NodeId *referenceTypeIds,
            size_t referenceTypeIdsSize)

{
  size_t sVar1;
  UA_ReferenceNode *pUVar2;
  UA_Boolean UVar3;
  UA_Node *pUVar4;
  UA_Boolean UVar5;
  size_t sVar6;
  size_t sVar7;
  UA_NodeId *n2;
  bool bVar8;
  
  UVar3 = UA_NodeId_equal(leafNode,nodeToFind);
  UVar5 = true;
  if (!UVar3) {
    pUVar4 = UA_NodeStore_get(ns,leafNode);
    if (pUVar4 != (UA_Node *)0x0) {
      sVar1 = pUVar4->referencesSize;
      for (sVar6 = 0; sVar6 != sVar1; sVar6 = sVar6 + 1) {
        pUVar2 = pUVar4->references;
        if (pUVar2[sVar6].isInverse == true) {
          sVar7 = referenceTypeIdsSize;
          n2 = referenceTypeIds;
          while (bVar8 = sVar7 != 0, sVar7 = sVar7 - 1, bVar8) {
            UVar3 = UA_NodeId_equal(&pUVar2[sVar6].referenceTypeId,n2);
            if ((UVar3) &&
               (UVar3 = isNodeInTree(ns,&pUVar2[sVar6].targetId.nodeId,nodeToFind,referenceTypeIds,
                                     referenceTypeIdsSize), UVar3)) {
              return true;
            }
            n2 = n2 + 1;
          }
        }
      }
    }
    UVar5 = false;
  }
  return UVar5;
}

Assistant:

UA_Boolean
isNodeInTree(UA_NodeStore *ns, const UA_NodeId *leafNode, const UA_NodeId *nodeToFind,
             const UA_NodeId *referenceTypeIds, size_t referenceTypeIdsSize) {
    if(UA_NodeId_equal(leafNode, nodeToFind))
        return true;

    const UA_Node *node = UA_NodeStore_get(ns,leafNode);
    if(!node)
        return false;

    /* Search upwards in the tree */
    for(size_t i = 0; i < node->referencesSize; ++i) {
        if(!node->references[i].isInverse)
            continue;

        /* Recurse only for valid reference types */
        for(size_t j = 0; j < referenceTypeIdsSize; ++j) {
            if(UA_NodeId_equal(&node->references[i].referenceTypeId, &referenceTypeIds[j]) &&
               isNodeInTree(ns, &node->references[i].targetId.nodeId, nodeToFind,
                            referenceTypeIds, referenceTypeIdsSize))
                return true;
        }
    }
    return false;
}